

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall MarrayTest::reshapeTest(MarrayTest *this)

{
  size_t sVar1;
  bool bVar2;
  CoordinateOrder local_70;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  Marray<int,_std::allocator<unsigned_long>_> m;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&local_70);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 4) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    bVar2 = sVar1 == 6;
  }
  else {
    bVar2 = false;
  }
  local_70 = CONCAT31(local_70._1_3_,bVar2);
  test((bool *)&local_70);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  local_70 = FirstMajorOrder;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&local_70,&local_69);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 4) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    bVar2 = sVar1 == 6;
  }
  else {
    bVar2 = false;
  }
  local_70 = CONCAT31(local_70._1_3_,bVar2);
  test((bool *)&local_70);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&local_70);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 2) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 != 3) goto LAB_0013ea84;
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
    bVar2 = sVar1 == 4;
  }
  else {
LAB_0013ea84:
    bVar2 = false;
  }
  local_70 = CONCAT31(local_70._1_3_,bVar2);
  test((bool *)&local_70);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&m);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  local_70 = FirstMajorOrder;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->scalar_,&local_70,&local_69);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&m,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if (sVar1 == 2) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,1);
    if (sVar1 == 3) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&m.super_View<int,_false,_std::allocator<unsigned_long>_>,2);
      bVar2 = sVar1 == 4;
      goto LAB_0013eb5c;
    }
  }
  bVar2 = false;
LAB_0013eb5c:
  local_70 = CONCAT31(local_70._1_3_,bVar2);
  test((bool *)&local_70);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&m);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void MarrayTest::reshapeTest() {
    // 2D 
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
}